

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  long in_R8;
  code *in_R9;
  secp256k1_scalar *in_stack_00000008;
  int ret;
  uchar seckey [32];
  uchar pk_buf [32];
  uchar buf [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar k;
  secp256k1_scalar e;
  secp256k1_scalar sk;
  secp256k1_fe *in_stack_fffffffffffffdc8;
  secp256k1_fe *a;
  secp256k1_callback *in_stack_fffffffffffffdd0;
  secp256k1_scalar *r_00;
  secp256k1_keypair *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar2;
  uint uVar3;
  secp256k1_scalar *in_stack_fffffffffffffde8;
  secp256k1_context *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  secp256k1_scalar *in_stack_fffffffffffffe18;
  secp256k1_scalar *in_stack_fffffffffffffe20;
  secp256k1_gej *in_stack_fffffffffffffe28;
  secp256k1_ge *in_stack_fffffffffffffe30;
  uchar *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  uchar *in_stack_fffffffffffffe60;
  uchar *in_stack_fffffffffffffe68;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffef0;
  code *local_38;
  uint local_4;
  
  memset(&stack0xfffffffffffffe28,0,0x20);
  uVar3 = 1;
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/schnorrsig/main_impl.h"
            ,0x91,"test condition failed: ctx != NULL");
    abort();
  }
  iVar1 = secp256k1_ecmult_gen_context_is_built(&in_RDI->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    local_4 = 0;
  }
  else if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    local_4 = 0;
  }
  else {
    uVar2 = CONCAT13(1,(int3)in_stack_fffffffffffffde0);
    if (in_RDX == 0) {
      uVar2 = CONCAT13(in_RCX == 0,(int3)in_stack_fffffffffffffde0);
    }
    if ((((byte)((uint)uVar2 >> 0x18) ^ 0xff) & 1) == 0) {
      if (in_R8 == 0) {
        secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
        local_4 = 0;
      }
      else {
        local_38 = in_R9;
        if (in_R9 == (code *)0x0) {
          local_38 = nonce_function_bip340;
        }
        local_4 = secp256k1_keypair_load
                            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                             (secp256k1_ge *)CONCAT44(uVar3,uVar2),in_stack_fffffffffffffdd8);
        local_4 = local_4 & uVar3;
        iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x108587);
        if (iVar1 != 0) {
          secp256k1_scalar_negate
                    ((secp256k1_scalar *)in_stack_fffffffffffffdd0,
                     (secp256k1_scalar *)in_stack_fffffffffffffdc8);
        }
        secp256k1_scalar_get_b32
                  ((uchar *)in_stack_fffffffffffffdd0,(secp256k1_scalar *)in_stack_fffffffffffffdc8)
        ;
        secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        a = (secp256k1_fe *)0xd;
        iVar1 = (*local_38)(&stack0xfffffffffffffe28,in_RDX,in_RCX,&stack0xfffffffffffffde8,
                            &stack0xfffffffffffffe08,"BIP0340/nonce");
        local_4 = iVar1 != 0 & local_4;
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)CONCAT44(local_4,uVar2),in_stack_fffffffffffffdd8->data,
                   (int *)in_stack_00000008);
        iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x10863f);
        local_4 = ((iVar1 != 0 ^ 0xffU) & 1) & local_4;
        secp256k1_scalar_cmov
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
        secp256k1_ecmult_gen
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        secp256k1_ge_set_gej(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        secp256k1_declassify(in_RDI,&stack0xfffffffffffffe50,0x68);
        secp256k1_fe_normalize_var((secp256k1_fe *)0x1086d4);
        iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x1086e5);
        r_00 = in_stack_00000008;
        if (iVar1 != 0) {
          secp256k1_scalar_negate(in_stack_00000008,(secp256k1_scalar *)a);
          r_00 = in_stack_00000008;
        }
        secp256k1_fe_normalize_var((secp256k1_fe *)0x108707);
        secp256k1_fe_get_b32((uchar *)r_00,a);
        secp256k1_schnorrsig_challenge
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        secp256k1_scalar_mul(r_00,(secp256k1_scalar *)a,(secp256k1_scalar *)0x10875e);
        secp256k1_scalar_add(r_00,(secp256k1_scalar *)a,(secp256k1_scalar *)0x108776);
        secp256k1_scalar_get_b32((uchar *)r_00,(secp256k1_scalar *)a);
        secp256k1_memczero(in_RSI,0x40,(uint)((local_4 != 0 ^ 0xffU) & 1));
        secp256k1_scalar_clear((secp256k1_scalar *)0x1087bd);
        secp256k1_scalar_clear((secp256k1_scalar *)0x1087ca);
        secp256k1_memclear((void *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe08);
        secp256k1_gej_clear((secp256k1_gej *)0x1087e6);
      }
    }
    else {
      secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    secp256k1_memclear(seckey, sizeof(seckey));
    secp256k1_gej_clear(&rj);

    return ret;
}